

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

CURLcode Curl_cpool_add_waitfds(cpool *cpool,curl_waitfds *cwfds)

{
  CURLcode CVar1;
  Curl_llist_node *pCVar2;
  connectdata *conn;
  easy_pollset ps;
  easy_pollset local_48;
  
  if (cpool != (cpool *)0x0) {
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool->field_0x98 = cpool->field_0x98 | 1;
  }
  pCVar2 = Curl_llist_head(&cpool->shutdowns);
  if (pCVar2 == (Curl_llist_node *)0x0) {
    CVar1 = CURLE_OK;
  }
  else {
    for (pCVar2 = Curl_llist_head(&cpool->shutdowns); CVar1 = CURLE_OK,
        pCVar2 != (Curl_llist_node *)0x0; pCVar2 = Curl_node_next(pCVar2)) {
      conn = (connectdata *)Curl_node_elem(pCVar2);
      local_48.sockets[0] = 0;
      local_48.sockets[1] = 0;
      local_48.sockets[2] = 0;
      local_48.sockets[3] = 0;
      local_48.sockets[4] = 0;
      local_48.num = 0;
      local_48.actions[0] = '\0';
      local_48.actions[1] = '\0';
      local_48.actions[2] = '\0';
      local_48.actions[3] = '\0';
      local_48.actions[4] = '\0';
      local_48._29_3_ = 0;
      Curl_attach_connection(cpool->idata,conn);
      Curl_conn_adjust_pollset(cpool->idata,&local_48);
      Curl_detach_connection(cpool->idata);
      CVar1 = Curl_waitfds_add_ps(cwfds,&local_48);
      if (CVar1 != CURLE_OK) break;
    }
  }
  if (cpool != (cpool *)0x0) {
    cpool->field_0x98 = cpool->field_0x98 & 0xfe;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_cpool_add_waitfds(struct cpool *cpool,
                                struct curl_waitfds *cwfds)
{
  CURLcode result = CURLE_OK;

  CPOOL_LOCK(cpool);
  if(Curl_llist_head(&cpool->shutdowns)) {
    struct Curl_llist_node *e;
    struct easy_pollset ps;
    struct connectdata *conn;

    for(e = Curl_llist_head(&cpool->shutdowns); e;
        e = Curl_node_next(e)) {
      conn = Curl_node_elem(e);
      memset(&ps, 0, sizeof(ps));
      Curl_attach_connection(cpool->idata, conn);
      Curl_conn_adjust_pollset(cpool->idata, &ps);
      Curl_detach_connection(cpool->idata);

      result = Curl_waitfds_add_ps(cwfds, &ps);
      if(result)
        goto out;
    }
  }
out:
  CPOOL_UNLOCK(cpool);
  return result;
}